

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O3

int mattackm(monst *magr,monst *mdef)

{
  int *piVar1;
  byte bVar2;
  char cVar3;
  permonst *mptr;
  permonst *ppVar4;
  permonst *ppVar5;
  boolean bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  obj *poVar12;
  attack *mattk;
  monst *pmVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  int tmp;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  bool bVar22;
  int res [6];
  attack alt_attk;
  char buf [256];
  uint local_198 [6];
  permonst *local_180;
  int local_174;
  permonst *local_170;
  permonst *local_168;
  permonst *local_160;
  permonst *local_158;
  permonst *local_150;
  permonst *local_148;
  attack local_13c;
  char local_138 [264];
  
  if (mdef == (monst *)0x0 || magr == (monst *)0x0) {
    return 0;
  }
  if ((*(uint *)&magr->field_0x60 & 0xc0000) != 0x40000) {
    return 0;
  }
  mptr = magr->data;
  ppVar4 = mdef->data;
  if (((mptr == mons + 0x78) && (magr->mx != mdef->mx)) && (magr->my != mdef->my)) {
    return 0;
  }
  iVar7 = find_mac(mdef);
  iVar7 = (uint)magr->m_lev + iVar7;
  uVar8 = *(uint *)&mdef->field_0x60;
  if ((uVar8 & 0x2c0000) != 0x40000) {
    iVar7 = iVar7 + 4;
    uVar8 = uVar8 & 0xfff7ffff;
    *(uint *)&mdef->field_0x60 = uVar8;
  }
  if ((char)uVar8 < '\0') {
    *(uint *)&mdef->field_0x60 = uVar8 & 0xffffff7f;
    newsym((int)mdef->mx,(int)mdef->my);
    if (mdef->wormno == '\0') {
      if ((viz_array[mdef->my][mdef->mx] & 2U) != 0) goto LAB_001c4efa;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c4d9a;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c4d91;
      }
      else {
LAB_001c4d91:
        if (ublindf == (obj *)0x0) goto LAB_001c4c4f;
LAB_001c4d9a:
        if (ublindf->oartifact != '\x1d') goto LAB_001c4c4f;
      }
      if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[mdef->my][mdef->mx] & 1U) == 0 || ((mdef->data->mflags3 & 0x200) == 0))))
      goto LAB_001c4c4f;
    }
    else {
      bVar6 = worm_known(level,mdef);
      if (bVar6 == '\0') goto LAB_001c4c4f;
    }
LAB_001c4efa:
    uVar8 = *(uint *)&mdef->field_0x60;
    if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar8 & 0x280) == 0) goto LAB_001c4f4d;
    }
    else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c4f4d:
      if ((u._1052_1_ & 0x20) == 0) {
        if (((mdef->data->mflags1 & 0x10000) == 0) &&
           ((poVar12 = which_armor(mdef,4), poVar12 == (obj *)0x0 ||
            (poVar12 = which_armor(mdef,4), poVar12->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c4fb0;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c4fab;
          }
          else {
LAB_001c4fab:
            if (ublindf != (obj *)0x0) {
LAB_001c4fb0:
              if (ublindf->oartifact == '\x1d') goto LAB_001c5121;
            }
            if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                 youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001c4c4f;
          }
LAB_001c5121:
          if ((u.uprops[0x19].extrinsic != 0) &&
             ((u.uprops[0x19].blocked == 0 &&
              (iVar10 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), iVar10 < 0x41))))
          goto LAB_001c4c4f;
        }
        if ((u.uprops[0x42].intrinsic == 0) &&
           ((u.uprops[0x42].extrinsic == 0 && (bVar6 = match_warn_of_mon(mdef), bVar6 == '\0')))) {
          if (u.usleep == 0) {
            pcVar14 = a_monnam(mdef);
            pcVar16 = "Suddenly, you notice %s.";
          }
          else {
            if ((mdef->data->geno & 0x1000) == 0) {
              pcVar14 = m_monnam(mdef);
              pcVar14 = makeplural(pcVar14);
            }
            else {
              pcVar14 = a_monnam(mdef);
            }
            pcVar16 = "You dream of %s.";
          }
          pline(pcVar16,pcVar14);
        }
      }
    }
  }
LAB_001c4c4f:
  if ((mptr->mflags2 & 0x10) != 0) {
    iVar7 = iVar7 + (uint)((ppVar4->mflags2 >> 7 & 1) != 0);
  }
  bVar22 = false;
  if ((viz_array[magr->my][magr->mx] & 2U) == 0) goto LAB_001c53f5;
  if ((viz_array[mdef->my][mdef->mx] & 2U) == 0) {
    bVar22 = false;
    goto LAB_001c53f5;
  }
  if ((magr->wormno == '\0') || (bVar6 = worm_known(level,magr), bVar6 != '\0')) {
    uVar8 = *(uint *)&magr->field_0x60;
    if (((uVar8 & 2) == 0) || ((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)))) {
      if ((uVar8 & 0x280) == 0) goto LAB_001c4db1;
    }
    else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c4db1:
      bVar22 = true;
      if ((u._1052_1_ & 0x20) == 0) goto LAB_001c53f5;
    }
  }
  if (((magr->data->mflags1 & 0x10000) == 0) &&
     ((poVar12 = which_armor(magr,4), poVar12 == (obj *)0x0 ||
      (poVar12 = which_armor(magr,4), poVar12->otyp != 0x4f)))) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c4e1c;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c4e17;
    }
    else {
LAB_001c4e17:
      if (ublindf != (obj *)0x0) {
LAB_001c4e1c:
        if (ublindf->oartifact == '\x1d') goto LAB_001c504e;
      }
      if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
           youmonst.data == mons + 0x32) && (bVar22 = true, u.uprops[0x19].blocked == 0))
      goto LAB_001c53f5;
    }
LAB_001c504e:
    if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
      iVar10 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy);
      bVar22 = true;
      if (iVar10 < 0x41) goto LAB_001c53f5;
    }
  }
  bVar22 = true;
  if (((u.uprops[0x42].intrinsic != 0) || (bVar22 = true, u.uprops[0x42].extrinsic != 0)) ||
     (bVar6 = match_warn_of_mon(magr), bVar6 != '\0')) goto LAB_001c53f5;
  if (mdef->wormno == '\0') {
    if ((viz_array[mdef->my][mdef->mx] & 2U) != 0) goto LAB_001c5274;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c51e8;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c51df;
    }
    else {
LAB_001c51df:
      if (ublindf == (obj *)0x0) goto LAB_001c52c3;
LAB_001c51e8:
      if (ublindf->oartifact != '\x1d') goto LAB_001c52c3;
    }
    if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
        (((youmonst.data)->mflags3 & 0x100) != 0)) &&
       (((viz_array[mdef->my][mdef->mx] & 1U) != 0 && ((mdef->data->mflags3 & 0x200) != 0))))
    goto LAB_001c5274;
  }
  else {
    bVar6 = worm_known(level,mdef);
    if (bVar6 != '\0') {
LAB_001c5274:
      uVar8 = *(uint *)&mdef->field_0x60;
      if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar8 & 0x280) == 0) goto LAB_001c52b5;
      }
      else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c52b5:
        if ((u._1052_1_ & 0x20) == 0) goto LAB_001c53f5;
      }
    }
  }
LAB_001c52c3:
  if (((mdef->data->mflags1 & 0x10000) == 0) &&
     ((poVar12 = which_armor(mdef,4), poVar12 == (obj *)0x0 ||
      (poVar12 = which_armor(mdef,4), poVar12->otyp != 0x4f)))) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c5314;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c530f;
    }
    else {
LAB_001c530f:
      if (ublindf != (obj *)0x0) {
LAB_001c5314:
        if (ublindf->oartifact == '\x1d') goto LAB_001c53a3;
      }
      if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
           youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001c53f5;
    }
LAB_001c53a3:
    if ((u.uprops[0x19].extrinsic != 0) &&
       ((u.uprops[0x19].blocked == 0 &&
        (iVar10 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), iVar10 < 0x41))))
    goto LAB_001c53f5;
  }
  if ((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) {
    bVar6 = match_warn_of_mon(mdef);
    bVar22 = bVar6 != '\0';
  }
LAB_001c53f5:
  vis = bVar22;
  magr->mlstmv = moves;
  local_148 = mons + 0xdb;
  local_150 = mons + 0xd6;
  local_158 = mons + 0xd5;
  local_170 = mons + 0x61;
  local_168 = mons + 0x1e;
  local_160 = mons + 0x127;
  uVar18 = 0;
  local_174 = 0;
  do {
    local_198[uVar18] = 0;
    iVar10 = (int)uVar18;
    mattk = getmattk(mptr,iVar10,(int *)local_198,&local_13c);
    otmp = (obj *)0x0;
    switch(mattk->aatyp) {
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\x10':
      goto switchD_001c54e3_caseD_1;
    case '\a':
      if (((uVar18 < 2) || (local_198[uVar18 - 1] != 1)) || (local_198[uVar18 - 2] != 1))
      goto LAB_001c59a1;
      uVar8 = hitmm(magr,mdef,mattk);
      local_198[uVar18] = uVar8;
      goto LAB_001c5a40;
    case '\b':
    case '\t':
    case '\n':
    case '\f':
    case '\x0e':
switchD_001c54e3_caseD_8:
      uVar8 = local_198[uVar18];
      uVar19 = 0;
      goto LAB_001c737e;
    case '\v':
      if ((u.usteed == mdef) || (((u._1052_1_ & 1) != 0 && (u.ustuck == magr)))) goto LAB_001c59a1;
      uVar8 = mt_random();
      bVar22 = iVar7 <= (int)(uVar8 % (iVar10 + 0x14U) + 1);
      if (bVar22) {
        missmm(magr,mdef,mattk);
      }
      else {
        uVar8 = gulpmm(magr,mdef,mattk);
        local_198[uVar18] = uVar8;
      }
      uVar19 = (uint)!bVar22;
      break;
    case '\r':
      if ((magr->field_0x61 & 1) == 0) {
        if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
          noises((monst *)(ulong)(byte)magr->mx,(attack *)(ulong)(byte)magr->my);
        }
        else {
          pcVar14 = Monnam(magr);
          pline("%s explodes!",pcVar14);
        }
        uVar8 = mdamagem(magr,mdef,mattk);
        if ((uVar8 & 4) == 0) {
          mondead(magr);
          if (0 < magr->mhp) {
            local_198[uVar18] = uVar8;
            uVar19 = 1;
            if (uVar8 != 0) break;
            goto LAB_001c5976;
          }
          uVar8 = uVar8 | 4;
        }
        if (magr->mtame != '\0') {
          pline("You have a %s feeling for a moment, then it passes.","melancholy");
        }
        local_198[uVar18] = uVar8;
        goto LAB_001c5a40;
      }
      local_198[uVar18] = 0;
LAB_001c5976:
      uVar8 = 0;
      goto LAB_001c739c;
    case '\x0f':
      if (vis != '\0') {
        pcVar14 = Monnam(magr);
        sprintf(local_138,"%s gazes at",pcVar14);
        pcVar14 = mon_nam(mdef);
        pline("%s %s...",local_138,pcVar14);
      }
      if ((((*(uint *)&magr->field_0x60 & 0x20100) == 0x20000) &&
          (((*(uint *)&magr->field_0x60 & 2) == 0 || ((mdef->data->mflags1 & 0x1000000) != 0)))) &&
         ((*(uint *)&mdef->field_0x60 & 0xa0000) == 0x20000)) {
        if ((magr->data == local_160) && (bVar6 = mon_reflects(mdef,(char *)0x0), bVar6 != '\0')) {
          if (mdef->wormno == '\0') {
            if ((viz_array[mdef->my][mdef->mx] & 2U) != 0) goto LAB_001c6a4d;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c6445;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c643c;
            }
            else {
LAB_001c643c:
              if (ublindf == (obj *)0x0) goto LAB_001c6aa6;
LAB_001c6445:
              if (ublindf->oartifact != '\x1d') goto LAB_001c6aa6;
            }
            if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                ((viz_array[mdef->my][mdef->mx] & 1U) != 0)) && ((mdef->data->mflags3 & 0x200) != 0)
               ) goto LAB_001c6a4d;
          }
          else {
            bVar6 = worm_known(level,mdef);
            if (bVar6 != '\0') {
LAB_001c6a4d:
              uVar8 = *(uint *)&mdef->field_0x60;
              if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar8 & 0x280) == 0) goto LAB_001c6a8e;
              }
              else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c6a8e:
                if ((u._1052_1_ & 0x20) == 0) {
                  mon_reflects(mdef,"The gaze is reflected away by %s %s.");
                }
              }
            }
          }
LAB_001c6aa6:
          if ((mdef->field_0x62 & 2) != 0) {
            bVar6 = mon_reflects(magr,(char *)0x0);
            if (bVar6 == '\0') {
              if (((mdef->field_0x60 & 2) != 0) && ((magr->data->mflags1 & 0x1000000) == 0)) {
                if (magr->wormno == '\0') {
                  if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
                    if (u.uprops[0x1e].intrinsic == 0) {
                      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c7653;
                      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c764a;
LAB_001c77b2:
                      if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                          (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                         (uVar8 = 0, (viz_array[magr->my][magr->mx] & 1U) != 0)) {
                        if ((magr->data->mflags3 & 0x200) == 0) goto LAB_001c599c;
                        goto LAB_001c7827;
                      }
                    }
                    else {
LAB_001c764a:
                      if (ublindf != (obj *)0x0) {
LAB_001c7653:
                        if (ublindf->oartifact == '\x1d') goto LAB_001c77b2;
                      }
                    }
                    uVar8 = 0;
                    goto LAB_001c599c;
                  }
                }
                else {
                  bVar6 = worm_known(level,magr);
                  if (bVar6 == '\0') goto LAB_001c75df;
                }
LAB_001c7827:
                uVar19 = *(uint *)&magr->field_0x60;
                if ((((uVar19 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar19 & 0x280) != 0) goto LAB_001c75df;
                }
                else {
                  uVar8 = 0;
                  if (((uVar19 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                  goto LAB_001c599c;
                }
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar14 = Monnam(magr);
                  iVar10 = pronoun_gender(level,magr);
                  uVar8 = 0;
                  pline("%s doesn\'t seem to notice that %s gaze was reflected.",pcVar14,
                        genders[iVar10].his);
                }
                else {
                  uVar8 = 0;
                }
                goto LAB_001c599c;
              }
              if (magr->wormno == '\0') {
                if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c76ba;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c6beb;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c6be2;
                }
                else {
LAB_001c6be2:
                  if (ublindf == (obj *)0x0) goto LAB_001c771d;
LAB_001c6beb:
                  if (ublindf->oartifact != '\x1d') goto LAB_001c771d;
                }
                if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                     (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                    ((viz_array[magr->my][magr->mx] & 1U) != 0)) &&
                   ((magr->data->mflags3 & 0x200) != 0)) goto LAB_001c76ba;
              }
              else {
                bVar6 = worm_known(level,magr);
                if (bVar6 != '\0') {
LAB_001c76ba:
                  uVar8 = *(uint *)&magr->field_0x60;
                  if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    if ((uVar8 & 0x280) == 0) goto LAB_001c76fb;
                  }
                  else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  {
LAB_001c76fb:
                    if ((u._1052_1_ & 0x20) == 0) {
                      pcVar14 = Monnam(magr);
                      pline("%s is turned to stone!",pcVar14);
                    }
                  }
                }
              }
LAB_001c771d:
              monstone(magr);
              uVar8 = (uint)(magr->mhp < 1) << 2;
              goto LAB_001c599c;
            }
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c7594;
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c6b99;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c6b90;
              }
              else {
LAB_001c6b90:
                if (ublindf == (obj *)0x0) goto LAB_001c75df;
LAB_001c6b99:
                if (ublindf->oartifact != '\x1d') goto LAB_001c75df;
              }
              if ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (((youmonst.data)->mflags3 & 0x100) != 0)) {
                uVar8 = 0;
                if (((viz_array[magr->my][magr->mx] & 1U) == 0) ||
                   ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001c599c;
                goto LAB_001c7594;
              }
            }
            else {
              bVar6 = worm_known(level,magr);
              if (bVar6 != '\0') {
LAB_001c7594:
                uVar19 = *(uint *)&magr->field_0x60;
                if ((((uVar19 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar19 & 0x280) != 0) goto LAB_001c75df;
                }
                else {
                  uVar8 = 0;
                  if (((uVar19 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                  goto LAB_001c599c;
                }
                uVar8 = 0;
                if ((u._1052_1_ & 0x20) == 0) {
                  mon_reflects(magr,"The gaze is reflected away by %s %s.");
                }
                goto LAB_001c599c;
              }
            }
LAB_001c75df:
            uVar8 = 0;
            goto LAB_001c599c;
          }
        }
        uVar8 = mdamagem(magr,mdef,mattk);
      }
      else {
        if (vis != '\0') {
          pline("but nothing happens.");
        }
        uVar8 = 0;
      }
LAB_001c599c:
      local_198[uVar18] = uVar8;
LAB_001c59a1:
      uVar19 = 0;
      break;
    default:
      if (mattk->aatyp != 0xfe) goto switchD_001c54e3_caseD_8;
      if ((magr->weapon_check == '\x01') || (magr->mw == (obj *)0x0)) {
        magr->weapon_check = '\x03';
        iVar9 = mon_wield_item(magr);
        if (iVar9 != 0) {
          return 0;
        }
      }
      possibly_unwield(magr,'\0');
      poVar12 = magr->mw;
      otmp = poVar12;
      if (poVar12 != (obj *)0x0) {
        if ((vis != '\0') && (flags.verbose != '\0')) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c55e8;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c55df;
LAB_001c5d4e:
            uVar8 = *(uint *)&magr->field_0x60;
            if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar8 & 0x280) == 0) goto LAB_001c5e0c;
            }
            else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c5e0c:
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar14 = mon_nam(mdef);
                strcpy(local_138,pcVar14);
                pcVar14 = Monnam(magr);
                pcVar16 = "thrusts";
                if ((*(ushort *)&objects[poVar12->otyp].field_0x11 & 4) == 0) {
                  pcVar16 = "swings";
                }
                iVar9 = pronoun_gender(level,magr);
                local_180 = (permonst *)genders[iVar9].his;
                pcVar15 = singular(poVar12,xname);
                pline("%s %s %s %s at %s.",pcVar14,pcVar16,local_180,pcVar15);
              }
            }
          }
          else {
LAB_001c55df:
            if (ublindf != (obj *)0x0) {
LAB_001c55e8:
              if (ublindf->oartifact == '\x1d') goto LAB_001c5d4e;
            }
          }
        }
        iVar9 = hitval(otmp,mdef);
        iVar7 = iVar7 + iVar9;
      }
switchD_001c54e3_caseD_1:
      iVar9 = distmin((int)magr->mx,(int)magr->my,(int)mdef->mx,(int)mdef->my);
      if (1 < iVar9) {
        return 0;
      }
      if ((((magr->field_0x62 & 0x20) == 0) && (u.uprops[0x15].intrinsic == 0)) &&
         ((u.uprops[0x15].extrinsic == 0 && (otmp != (obj *)0x0)))) {
        ppVar4 = mdef->data;
        if (ppVar4 != local_148) {
          if (mattk->aatyp != 0xfe) goto LAB_001c5603;
          goto LAB_001c5630;
        }
        if ((mattk->aatyp != 0xfe) && ((magr->mintrinsics & 8) != 0)) {
LAB_001c5603:
          if (ppVar4 != mons + 0xb && ppVar4 != mons + 0xc) goto LAB_001c5630;
        }
      }
      else {
LAB_001c5630:
        uVar8 = mt_random();
        iVar9 = uVar8 % (iVar10 + 0x14U) + 1;
        dieroll = iVar9;
        iVar10 = iVar7;
        if (otmp != (obj *)0x0) {
          iVar10 = hitval(otmp,mdef);
          iVar10 = iVar7 - iVar10;
        }
        if (iVar9 < iVar7) {
          uVar8 = hitmm(magr,mdef,mattk);
          local_198[uVar18] = uVar8;
          if (mdef->data == local_150) {
            if (otmp != (obj *)0x0) goto LAB_001c5700;
          }
          else if (mdef->data == local_158 && otmp != (obj *)0x0) {
LAB_001c5700:
            if ((((*(ushort *)&objects[otmp->otyp].field_0x11 & 0x1f0) == 0xb0) && (1 < mdef->mhp))
               && ((mdef->field_0x61 & 1) == 0)) {
              pmVar13 = clone_mon(mdef,'\0','\0');
              iVar7 = iVar10;
              if ((pmVar13 != (monst *)0x0) && (vis != '\0')) {
                pcVar14 = Monnam(mdef);
                strcpy(local_138,pcVar14);
                pcVar14 = mon_nam(magr);
                pline("%s divides as %s hits it!",local_138,pcVar14);
              }
LAB_001c5a40:
              uVar19 = 1;
              break;
            }
          }
          uVar19 = 1;
          iVar7 = iVar10;
          break;
        }
        missmm(magr,mdef,mattk);
        iVar7 = iVar10;
      }
      uVar19 = 0;
    }
    uVar8 = local_198[uVar18];
    if ((uVar8 & 4) == 0) {
      uVar8 = uVar8 & 2;
      ppVar4 = mdef->data;
      ppVar5 = magr->data;
      lVar21 = 0x13;
LAB_001c5a69:
      if (*(char *)((long)ppVar4->mattk + lVar21 + -0x13) != '\0') break;
      bVar2 = *(byte *)((long)ppVar4->mattk + lVar21 + -0x11);
      uVar17 = (uint)bVar2;
      local_180 = ppVar5;
      if (bVar2 == 0) {
        bVar2 = *(byte *)((long)&((permonst *)(ppVar4->mattk + -4))->mname + lVar21);
        uVar17 = 0;
        if (bVar2 != 0) {
          uVar20 = (int)ppVar4->mlevel + 1;
          for (uVar11 = uVar20; uVar11 != 0; uVar11 = uVar11 - 1) {
            uVar17 = mt_random();
            uVar20 = uVar20 + uVar17 % (uint)bVar2;
            uVar17 = uVar20;
          }
        }
      }
      else {
        bVar2 = *(byte *)((long)&((permonst *)(ppVar4->mattk + -4))->mname + lVar21);
        uVar20 = uVar17;
        do {
          uVar11 = mt_random();
          uVar17 = uVar17 + uVar11 % (uint)bVar2;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      cVar3 = *(char *)((long)ppVar4->mattk + lVar21 + -0x12);
      uVar20 = uVar17;
      if (cVar3 == '\x01') {
        bVar6 = resists_magm(magr);
        if (bVar6 != '\0') {
          if (magr->wormno == '\0') {
            if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c5c7b;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c5c72;
              }
              else {
LAB_001c5c72:
                if (ublindf == (obj *)0x0) goto LAB_001c5ff9;
LAB_001c5c7b:
                if (ublindf->oartifact != '\x1d') goto LAB_001c5ff9;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  ((viz_array[magr->my][magr->mx] & 1U) == 0)) ||
                 ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001c5ff9;
            }
          }
          else {
            bVar6 = worm_known(level,magr);
            if (bVar6 == '\0') goto LAB_001c5ff9;
          }
          uVar20 = *(uint *)&magr->field_0x60;
          if ((((uVar20 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar20 & 0x280) == 0) goto LAB_001c5fb8;
          }
          else if (((uVar20 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c5fb8:
            if ((u._1052_1_ & 0x20) == 0) {
              shieldeff(magr->mx,magr->my);
              pcVar14 = mon_nam(magr);
              pline("A hail of magic missiles narrowly misses %s!",pcVar14);
            }
          }
          goto LAB_001c5ff9;
        }
        if (magr->wormno == '\0') {
          if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c62b1;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c5cdd;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c5cd4;
          }
          else {
LAB_001c5cd4:
            if (ublindf == (obj *)0x0) goto LAB_001c735b;
LAB_001c5cdd:
            if (ublindf->oartifact != '\x1d') goto LAB_001c735b;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[magr->my][magr->mx] & 1U) != 0)) && ((magr->data->mflags3 & 0x200) != 0))
          goto LAB_001c62b1;
        }
        else {
          bVar6 = worm_known(level,magr);
          if (bVar6 != '\0') {
LAB_001c62b1:
            uVar17 = *(uint *)&magr->field_0x60;
            if ((((uVar17 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar17 & 0x280) == 0) goto LAB_001c631d;
            }
            else if (((uVar17 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c631d:
              if ((u._1052_1_ & 0x20) == 0) {
                if (magr->data == local_170) {
                  pline("ZOT!");
                }
                else {
                  pcVar14 = Monnam(magr);
                  pline("%s is caught in a hail of magic missiles!",pcVar14);
                }
              }
            }
          }
        }
        goto LAB_001c735b;
      }
      if (cVar3 != ')') {
        if (cVar3 != '\b') goto LAB_001c5ff9;
        if ((char)uVar19 == '\0') goto LAB_001c69ee;
        uVar17 = mt_random();
        if ((uVar17 & 1) != 0) {
          uVar20 = 0;
          goto LAB_001c735b;
        }
        pcVar14 = Monnam(magr);
        strcpy(local_138,pcVar14);
        if (magr->wormno == '\0') {
          if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c64d2;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c5df2;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c5de9;
          }
          else {
LAB_001c5de9:
            if (ublindf == (obj *)0x0) goto LAB_001c6563;
LAB_001c5df2:
            if (ublindf->oartifact != '\x1d') goto LAB_001c6563;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[magr->my][magr->mx] & 1U) != 0)) && ((magr->data->mflags3 & 0x200) != 0))
          goto LAB_001c64d2;
        }
        else {
          bVar6 = worm_known(level,magr);
          if (bVar6 != '\0') {
LAB_001c64d2:
            uVar17 = *(uint *)&magr->field_0x60;
            if ((((uVar17 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar17 & 0x280) == 0) goto LAB_001c6521;
            }
            else if (((uVar17 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c6521:
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar14 = mon_nam(mdef);
                pcVar14 = s_suffix(pcVar14);
                pline("%s is splashed by %s acid!",local_138,pcVar14);
              }
            }
          }
        }
LAB_001c6563:
        if ((magr->mintrinsics & 0x40) == 0) goto LAB_001c735b;
        if (magr->wormno == '\0') {
          if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c65e9;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c65e0;
            }
            else {
LAB_001c65e0:
              if (ublindf == (obj *)0x0) goto LAB_001c69ee;
LAB_001c65e9:
              if (ublindf->oartifact != '\x1d') goto LAB_001c69ee;
            }
            if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                 (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                ((viz_array[magr->my][magr->mx] & 1U) == 0)) || ((magr->data->mflags3 & 0x200) == 0)
               ) goto LAB_001c69ee;
          }
        }
        else {
          bVar6 = worm_known(level,magr);
          if (bVar6 == '\0') goto LAB_001c69ee;
        }
        uVar17 = *(uint *)&magr->field_0x60;
        if ((((uVar17 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
           (u.uprops[0xc].extrinsic == 0)) {
          if (((uVar17 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
          goto LAB_001c69b0;
          goto LAB_001c69ee;
        }
        if ((uVar17 & 0x280) != 0) goto LAB_001c69ee;
LAB_001c69b0:
        uVar20 = 0;
        if ((u._1052_1_ & 0x20) != 0) goto LAB_001c735b;
        pcVar14 = Monnam(magr);
        pline("%s is not affected.",pcVar14);
LAB_001c7521:
        uVar20 = 0;
        goto LAB_001c735b;
      }
      if (((char)uVar19 != '\0') && (otmp != (obj *)0x0 && (mdef->field_0x61 & 1) == 0)) {
        drain_item(otmp);
      }
LAB_001c5ff9:
      if ((uVar8 == 0) && ((mdef->field_0x61 & 1) == 0)) {
        uVar11 = mt_random();
        uVar20 = 0;
        if (uVar11 * -0x55555555 < 0x55555556) goto LAB_001c735b;
        bVar2 = *(byte *)((long)ppVar4->mattk + lVar21 + -0x12);
        if (bVar2 < 6) {
          if (bVar2 != 2) {
            if (bVar2 != 3) goto LAB_001c735b;
            if ((magr->mintrinsics & 2) == 0) {
              if (magr->wormno == '\0') {
                if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c729e;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c6889;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c6880;
                }
                else {
LAB_001c6880:
                  if (ublindf == (obj *)0x0) goto LAB_001c7316;
LAB_001c6889:
                  if (ublindf->oartifact != '\x1d') goto LAB_001c7316;
                }
                if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                     (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                    ((viz_array[magr->my][magr->mx] & 1U) != 0)) &&
                   ((magr->data->mflags3 & 0x200) != 0)) goto LAB_001c729e;
              }
              else {
                bVar6 = worm_known(level,magr);
                if (bVar6 != '\0') {
LAB_001c729e:
                  uVar20 = *(uint *)&magr->field_0x60;
                  if ((((uVar20 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    if ((uVar20 & 0x280) == 0) goto LAB_001c72ed;
                  }
                  else if (((uVar20 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  {
LAB_001c72ed:
                    if ((u._1052_1_ & 0x20) == 0) {
                      pcVar14 = Monnam(magr);
                      pline("%s is suddenly very cold!",pcVar14);
                    }
                  }
                }
              }
LAB_001c7316:
              iVar9 = (int)uVar17 / 2 + mdef->mhp;
              mdef->mhp = iVar9;
              iVar10 = mdef->mhpmax;
              if (mdef->mhpmax < iVar9) {
                mdef->mhpmax = iVar9;
                iVar10 = iVar9;
              }
              uVar20 = uVar17;
              if ((int)((uint)mdef->m_lev * 8 + 8) < iVar10) {
                split_mon(mdef,magr);
              }
            }
            else {
              if (magr->wormno == '\0') {
                if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
                  uVar20 = 0;
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c68f0;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c68e7;
                  }
                  else {
LAB_001c68e7:
                    if (ublindf == (obj *)0x0) goto LAB_001c735b;
LAB_001c68f0:
                    if (ublindf->oartifact != '\x1d') goto LAB_001c735b;
                  }
                  if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                     (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_001c735b;
                  if (((viz_array[magr->my][magr->mx] & 1U) == 0) ||
                     ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001c69ee;
                }
              }
              else {
                bVar6 = worm_known(level,magr);
                if (bVar6 == '\0') goto LAB_001c69ee;
              }
              uVar11 = *(uint *)&magr->field_0x60;
              if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                uVar20 = 0;
                if ((uVar11 & 0x280) == 0) goto LAB_001c74e5;
              }
              else {
                uVar20 = 0;
                if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c74e5:
                  uVar20 = 0;
                  if ((u._1052_1_ & 0x20) == 0) {
                    pcVar14 = Monnam(magr);
                    pline("%s is mildly chilly.",pcVar14);
                    iVar10 = 3;
                    goto LAB_001c751a;
                  }
                }
              }
            }
            goto LAB_001c735b;
          }
          if ((magr->mintrinsics & 1) == 0) {
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c67c9;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c67c0;
                }
                else {
LAB_001c67c0:
                  uVar20 = uVar17;
                  if (ublindf == (obj *)0x0) goto LAB_001c735b;
LAB_001c67c9:
                  uVar20 = uVar17;
                  if (ublindf->oartifact != '\x1d') goto LAB_001c735b;
                }
                if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                     (uVar20 = uVar17, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
                    (uVar20 = uVar17, (viz_array[magr->my][magr->mx] & 1U) == 0)) ||
                   ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001c735b;
              }
            }
            else {
              bVar6 = worm_known(level,magr);
              uVar20 = uVar17;
              if (bVar6 == '\0') goto LAB_001c735b;
            }
            uVar11 = *(uint *)&magr->field_0x60;
            if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              uVar20 = uVar17;
              if ((uVar11 & 0x280) == 0) goto LAB_001c70e3;
            }
            else {
              uVar20 = uVar17;
              if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c70e3:
                uVar20 = uVar17;
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar14 = Monnam(magr);
                  pcVar16 = "%s is suddenly very hot!";
                  goto LAB_001c7102;
                }
              }
            }
          }
          else {
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
                uVar20 = 0;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c6830;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c6827;
                }
                else {
LAB_001c6827:
                  if (ublindf == (obj *)0x0) goto LAB_001c735b;
LAB_001c6830:
                  if (ublindf->oartifact != '\x1d') goto LAB_001c735b;
                }
                if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_001c735b;
                if (((viz_array[magr->my][magr->mx] & 1U) == 0) ||
                   ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001c69ee;
              }
            }
            else {
              bVar6 = worm_known(level,magr);
              if (bVar6 == '\0') goto LAB_001c69ee;
            }
            uVar11 = *(uint *)&magr->field_0x60;
            if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              uVar20 = 0;
              if ((uVar11 & 0x280) == 0) goto LAB_001c71fd;
            }
            else {
              uVar20 = 0;
              if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c71fd:
                uVar20 = 0;
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar14 = Monnam(magr);
                  pline("%s is mildly warmed.",pcVar14);
                  iVar10 = 2;
LAB_001c751a:
                  golemeffects(magr,iVar10,uVar17);
                  goto LAB_001c7521;
                }
              }
            }
          }
LAB_001c735b:
          piVar1 = &magr->mhp;
          iVar10 = *piVar1;
          *piVar1 = *piVar1 - uVar20;
          if (*piVar1 != 0 && SBORROW4(iVar10,uVar20) == *piVar1 < 0) goto LAB_001c7361;
          monkilled(magr,"",(uint)*(byte *)((long)ppVar4->mattk + lVar21 + -0x12));
          uVar8 = uVar8 + uVar19 + 4;
        }
        else {
          if (bVar2 == 6) {
            if ((magr->mintrinsics & 0x10) != 0) {
              if (magr->wormno == '\0') {
                if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c6e4a;
                uVar20 = 0;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c670d;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c6704;
                }
                else {
LAB_001c6704:
                  if (ublindf == (obj *)0x0) goto LAB_001c735b;
LAB_001c670d:
                  if (ublindf->oartifact != '\x1d') goto LAB_001c735b;
                }
                if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_001c735b;
                if (((viz_array[magr->my][magr->mx] & 1U) != 0) &&
                   ((magr->data->mflags3 & 0x200) != 0)) goto LAB_001c6e4a;
              }
              else {
                bVar6 = worm_known(level,magr);
                if (bVar6 != '\0') {
LAB_001c6e4a:
                  uVar11 = *(uint *)&magr->field_0x60;
                  if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    uVar20 = 0;
                    if ((uVar11 & 0x280) == 0) goto LAB_001c6ec0;
                  }
                  else {
                    uVar20 = 0;
                    if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c6ec0:
                      uVar20 = 0;
                      if ((u._1052_1_ & 0x20) == 0) {
                        pcVar14 = Monnam(magr);
                        pline("%s is mildly tingled.",pcVar14);
                        iVar10 = 6;
                        goto LAB_001c751a;
                      }
                    }
                  }
                  goto LAB_001c735b;
                }
              }
LAB_001c69ee:
              uVar20 = 0;
              goto LAB_001c735b;
            }
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c66a6;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c669d;
                }
                else {
LAB_001c669d:
                  uVar20 = uVar17;
                  if (ublindf == (obj *)0x0) goto LAB_001c735b;
LAB_001c66a6:
                  uVar20 = uVar17;
                  if (ublindf->oartifact != '\x1d') goto LAB_001c735b;
                }
                if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                     (uVar20 = uVar17, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
                    (uVar20 = uVar17, (viz_array[magr->my][magr->mx] & 1U) == 0)) ||
                   ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001c735b;
              }
            }
            else {
              bVar6 = worm_known(level,magr);
              uVar20 = uVar17;
              if (bVar6 == '\0') goto LAB_001c735b;
            }
            uVar11 = *(uint *)&magr->field_0x60;
            if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              uVar20 = uVar17;
              if ((uVar11 & 0x280) == 0) goto LAB_001c6db7;
            }
            else {
              uVar20 = uVar17;
              if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c6db7:
                uVar20 = uVar17;
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar14 = Monnam(magr);
                  pcVar16 = "%s is jolted with electricity!";
LAB_001c7102:
                  pline(pcVar16,pcVar14);
                  uVar20 = uVar17;
                }
              }
            }
            goto LAB_001c735b;
          }
          if (bVar2 == 0xc) {
            if ((*(uint *)&magr->field_0x60 >> 0x14 & 1) != 0) goto LAB_001c735b;
            uVar17 = *(uint *)&magr->field_0x60 | 0x100000;
            *(uint *)&magr->field_0x60 = uVar17;
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c6767;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c675e;
                }
                else {
LAB_001c675e:
                  if (ublindf == (obj *)0x0) goto LAB_001c735b;
LAB_001c6767:
                  if (ublindf->oartifact != '\x1d') goto LAB_001c735b;
                }
                if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                     (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                    ((viz_array[magr->my][magr->mx] & 1U) == 0)) ||
                   ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001c735b;
              }
            }
            else {
              bVar6 = worm_known(level,magr);
              if (bVar6 == '\0') goto LAB_001c69ee;
              uVar17 = *(uint *)&magr->field_0x60;
            }
            uVar20 = 0;
            if ((((uVar17 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              uVar20 = 0;
              if ((uVar17 & 0x280) == 0) goto LAB_001c6fbd;
            }
            else if (((uVar17 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c6fbd:
              uVar20 = 0;
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar14 = Monnam(magr);
                pcVar16 = stagger(magr->data,"stagger");
                pcVar16 = makeplural(pcVar16);
                pline("%s %s...",pcVar14,pcVar16);
                goto LAB_001c7521;
              }
            }
            goto LAB_001c735b;
          }
          if (bVar2 != 0xe) goto LAB_001c735b;
          if (0x7e < (int)uVar17) {
            uVar17 = 0x7f;
          }
          if (ppVar4 == local_168) {
            uVar8 = 1;
            if (((((magr->field_0x62 & 2) != 0) && ((local_180->mflags1 >> 0xc & 1) == 0)) &&
                ((*(uint *)&mdef->field_0x60 >> 0x11 & 1) != 0)) &&
               (((local_180->mflags1 >> 0x18 & 1) == 0 &
                (byte)((*(uint *)&mdef->field_0x60 & 2) >> 1)) == 0)) {
              pcVar14 = mon_nam(mdef);
              pcVar14 = s_suffix(pcVar14);
              sprintf(local_138,"%s gaze is reflected by %%s %%s.",pcVar14);
              if (magr->wormno == '\0') {
                if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c7960;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c777d;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c7774;
LAB_001c7900:
                  if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                      (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                     ((viz_array[magr->my][magr->mx] & 1U) != 0)) {
                    pcVar14 = (char *)0x0;
                    if ((magr->data->mflags3 & 0x200) != 0) goto LAB_001c7960;
                    goto LAB_001c79f2;
                  }
                }
                else {
LAB_001c7774:
                  if (ublindf != (obj *)0x0) {
LAB_001c777d:
                    if (ublindf->oartifact == '\x1d') goto LAB_001c7900;
                  }
                }
LAB_001c79da:
                pcVar14 = (char *)0x0;
              }
              else {
                bVar6 = worm_known(level,magr);
                if (bVar6 == '\0') {
LAB_001c79bc:
                  pcVar14 = (char *)0x0;
                }
                else {
LAB_001c7960:
                  uVar8 = *(uint *)&magr->field_0x60;
                  if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    if ((uVar8 & 0x280) != 0) goto LAB_001c79bc;
                  }
                  else {
                    if ((uVar8 & 0x280) != 0) goto LAB_001c79da;
                    pcVar14 = (char *)0x0;
                    if (((youmonst.data)->mflags1 & 0x1000000) == 0) goto LAB_001c79f2;
                  }
                  pcVar14 = (char *)0x0;
                  if ((u._1052_1_ & 0x20) == 0) {
                    pcVar14 = local_138;
                  }
                }
              }
LAB_001c79f2:
              bVar6 = mon_reflects(magr,pcVar14);
              uVar8 = uVar19;
              if (bVar6 == '\0') {
                pcVar14 = Monnam(magr);
                strcpy(local_138,pcVar14);
                if (magr->wormno == '\0') {
                  if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c7b08;
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c7a9a;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c7a91;
                  }
                  else {
LAB_001c7a91:
                    if (ublindf == (obj *)0x0) goto LAB_001c7b9c;
LAB_001c7a9a:
                    if (ublindf->oartifact != '\x1d') goto LAB_001c7b9c;
                  }
                  if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                      (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                     (((viz_array[magr->my][magr->mx] & 1U) != 0 &&
                      ((magr->data->mflags3 & 0x200) != 0)))) goto LAB_001c7b08;
                }
                else {
                  bVar6 = worm_known(level,magr);
                  if (bVar6 != '\0') {
LAB_001c7b08:
                    uVar8 = *(uint *)&magr->field_0x60;
                    if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                       (u.uprops[0xc].extrinsic != 0)) {
                      if ((uVar8 & 0x280) == 0) goto LAB_001c7b61;
                    }
                    else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)
                            ) {
LAB_001c7b61:
                      if ((u._1052_1_ & 0x20) == 0) {
                        pcVar14 = mon_nam(mdef);
                        pcVar14 = s_suffix(pcVar14);
                        pline("%s is frozen by %s gaze!",local_138,pcVar14);
                      }
                    }
                  }
                }
LAB_001c7b9c:
                magr->field_0x62 = magr->field_0x62 & 0xfb;
                magr->mfrozen = (uchar)uVar17;
                uVar8 = uVar19;
              }
            }
          }
          else {
            pcVar14 = Monnam(magr);
            strcpy(local_138,pcVar14);
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c6c5a;
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001c6644;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001c663b;
              }
              else {
LAB_001c663b:
                if (ublindf == (obj *)0x0) goto LAB_001c6cce;
LAB_001c6644:
                if (ublindf->oartifact != '\x1d') goto LAB_001c6cce;
              }
              if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                   (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                  ((viz_array[magr->my][magr->mx] & 1U) != 0)) &&
                 ((magr->data->mflags3 & 0x200) != 0)) goto LAB_001c6c5a;
            }
            else {
              bVar6 = worm_known(level,magr);
              if (bVar6 != '\0') {
LAB_001c6c5a:
                uVar8 = *(uint *)&magr->field_0x60;
                if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar8 & 0x280) == 0) goto LAB_001c6c9b;
                }
                else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c6c9b:
                  if ((u._1052_1_ & 0x20) == 0) {
                    pcVar14 = mon_nam(mdef);
                    pline("%s is frozen by %s.",local_138,pcVar14);
                  }
                }
              }
            }
LAB_001c6cce:
            magr->field_0x62 = magr->field_0x62 & 0xfb;
            magr->mfrozen = (uchar)uVar17;
            uVar8 = uVar19;
          }
        }
      }
      else {
LAB_001c7361:
        uVar8 = uVar8 | uVar19;
      }
      local_198[uVar18] = uVar8;
    }
LAB_001c737e:
    if ((uVar8 & 2) != 0) {
      return uVar8;
    }
    if ((char)uVar19 != '\0') {
      mdef->field_0x62 = mdef->field_0x62 & 0xf7;
    }
    if ((uVar8 & 4) != 0) {
      return uVar8;
    }
LAB_001c739c:
    if ((*(uint *)&magr->field_0x60 & 0xc0000) != 0x40000) {
      return uVar8;
    }
    if ((uVar8 & 1) != 0) {
      local_174 = 1;
    }
    uVar18 = uVar18 + 1;
    if (uVar18 == 6) {
      return (uint)(local_174 != 0);
    }
  } while( true );
  lVar21 = lVar21 + 4;
  if (lVar21 == 0x2b) goto LAB_001c7361;
  goto LAB_001c5a69;
}

Assistant:

int mattackm(struct monst *magr, struct monst *mdef)
{
    int		    i,		/* loop counter */
		    tmp,	/* amour class difference */
		    strike,	/* hit this attack */
		    attk,	/* attack attempted this time */
		    struck = 0,	/* hit at least once */
		    res[NATTK];	/* results of all attacks */
    const struct attack *mattk;
    struct attack alt_attk;
    const struct permonst *pa, *pd;

    if (!magr || !mdef) return MM_MISS;		/* mike@genat */
    if (!magr->mcanmove || magr->msleeping) return MM_MISS;
    pa = magr->data;
    pd = mdef->data;

    /* Grid bugs cannot attack at an angle. */
    if (pa == &mons[PM_GRID_BUG] && magr->mx != mdef->mx
						&& magr->my != mdef->my)
	return MM_MISS;

    /* Calculate the armour class differential. */
    tmp = find_mac(mdef) + magr->m_lev;
    if (mdef->mconf || !mdef->mcanmove || mdef->msleeping) {
	tmp += 4;
	mdef->msleeping = 0;
    }

    /* undetect monsters become un-hidden if they are attacked */
    if (mdef->mundetected) {
	mdef->mundetected = 0;
	newsym(mdef->mx, mdef->my);
	if (canseemon(level, mdef) && !sensemon(mdef)) {
	    if (u.usleep) pline("You dream of %s.",
				(mdef->data->geno & G_UNIQ) ?
				a_monnam(mdef) : makeplural(m_monnam(mdef)));
	    else pline("Suddenly, you notice %s.", a_monnam(mdef));
	}
    }

    /* Elves hate orcs. */
    if (is_elf(pa) && is_orc(pd)) tmp++;


    /* Set up the visibility of action */
    vis = (cansee(magr->mx,magr->my) && cansee(mdef->mx,mdef->my) && (canspotmon(level, magr) || canspotmon(level, mdef)));

    /*	Set flag indicating monster has moved this turn.  Necessary since a
     *	monster might get an attack out of sequence (i.e. before its move) in
     *	some cases, in which case this still counts as its move for the round
     *	and it shouldn't move again.
     */
    magr->mlstmv = moves;

    /* Now perform all attacks for the monster. */
    for (i = 0; i < NATTK; i++) {
	res[i] = MM_MISS;
	mattk = getmattk(pa, i, res, &alt_attk);
	otmp = NULL;
	attk = 1;
	switch (mattk->aatyp) {
	    case AT_WEAP:		/* "hand to hand" attacks */
		if (magr->weapon_check == NEED_WEAPON || !MON_WEP(magr)) {
		    magr->weapon_check = NEED_HTH_WEAPON;
		    if (mon_wield_item(magr) != 0) return 0;
		}
		possibly_unwield(magr, FALSE);
		otmp = MON_WEP(magr);

		if (otmp) {
		    if (vis) mswingsm(magr, mdef, otmp);
		    tmp += hitval(otmp, mdef);
		}
		/* fall through */
	    case AT_CLAW:
	    case AT_KICK:
	    case AT_BITE:
	    case AT_STNG:
	    case AT_TUCH:
	    case AT_BUTT:
	    case AT_TENT:
		/* Nymph that teleported away on first attack? */
		if (distmin(magr->mx,magr->my,mdef->mx,mdef->my) > 1)
		    return MM_MISS;
		/* Monsters won't attack cockatrices physically if they
		 * have a weapon instead.  They won't attack
		 * disintegrators with a weapon either.  This instinct
		 * doesn't work for players, or under conflict or
		 * confusion.
		 */
		if (!magr->mconf && !Conflict && otmp &&
		    ((touch_disintegrates(mdef->data) &&
		      (mattk->aatyp == AT_WEAP || !resists_disint(magr))) ||
		     (mattk->aatyp != AT_WEAP && touch_petrifies(mdef->data)))) {
		    strike = 0;
		    break;
		}
		dieroll = rnd(20 + i);
		strike = (tmp > dieroll);
		/* KMH -- don't accumulate to-hit bonuses */
		if (otmp)
		    tmp -= hitval(otmp, mdef);
		if (strike) {
		    res[i] = hitmm(magr, mdef, mattk);
		    if ((mdef->data == &mons[PM_BLACK_PUDDING] || mdef->data == &mons[PM_BROWN_PUDDING])
		       && otmp && objects[otmp->otyp].oc_material == IRON
		       && mdef->mhp > 1 && !mdef->mcan)
		    {
			if (clone_mon(mdef, 0, 0)) {
			    if (vis) {
				char buf[BUFSZ];

				strcpy(buf, Monnam(mdef));
				pline("%s divides as %s hits it!", buf, mon_nam(magr));
			    }
			}
		    }
		} else
		    missmm(magr, mdef, mattk);
		break;

	    case AT_HUGS:	/* automatic if prev two attacks succeed */
		strike = (i >= 2 && res[i-1] == MM_HIT && res[i-2] == MM_HIT);
		if (strike)
		    res[i] = hitmm(magr, mdef, mattk);

		break;

	    case AT_GAZE:
		strike = 0;	/* will not wake up a sleeper */
		res[i] = gazemm(magr, mdef, mattk);
		break;

	    case AT_EXPL:
		res[i] = explmm(magr, mdef, mattk);
		if (res[i] == MM_MISS) { /* cancelled--no attack */
		    strike = 0;
		    attk = 0;
		} else
		    strike = 1;	/* automatic hit */
		break;

	    case AT_ENGL:
		if (u.usteed && (mdef == u.usteed)) {
		    strike = 0;
		    break;
		} 
		/* Engulfing attacks are directed at the hero if
		 * possible. -dlc
		 */
		if (u.uswallow && magr == u.ustuck)
		    strike = 0;
		else {
		    if ((strike = (tmp > rnd(20+i))))
			res[i] = gulpmm(magr, mdef, mattk);
		    else
			missmm(magr, mdef, mattk);
		}
		break;

	    default:		/* no attack */
		strike = 0;
		attk = 0;
		break;
	}

	if (attk && !(res[i] & MM_AGR_DIED))
	    res[i] = passivemm(magr, mdef, strike, res[i] & MM_DEF_DIED);

	if (res[i] & MM_DEF_DIED) return res[i];

	/*
	 *  Wake up the defender.  NOTE:  this must follow the check
	 *  to see if the defender died.  We don't want to modify
	 *  unallocated monsters!
	 */
	if (strike) mdef->msleeping = 0;

	if (res[i] & MM_AGR_DIED)  return res[i];
	/* return if aggressor can no longer attack */
	if (!magr->mcanmove || magr->msleeping) return res[i];
	if (res[i] & MM_HIT) struck = 1;	/* at least one hit */
    }

    return struck ? MM_HIT : MM_MISS;
}